

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
__thiscall ninx::parser::Parser::parse_statement(Parser *this)

{
  TokenReader *this_00;
  char cVar1;
  int iVar2;
  Token *pTVar3;
  Text *this_01;
  Limiter *this_02;
  iterator iVar4;
  Variable *this_03;
  string *psVar5;
  long in_RSI;
  undefined1 local_50 [8];
  char limiter;
  undefined3 uStack_47;
  undefined4 uStack_44;
  string name;
  
  this_00 = (TokenReader *)(in_RSI + 0x20);
  pTVar3 = TokenReader::get_token(this_00);
  if (pTVar3 == (Token *)0x0) {
switchD_0011f397_caseD_2:
    (this->origin)._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    iVar2 = (*pTVar3->_vptr_Token[2])(pTVar3);
    switch(iVar2) {
    case 0:
      this_01 = (Text *)__dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                                       &lexer::token::Text::typeinfo,0);
      lexer::token::Text::get_text_abi_cxx11_(this_01);
      std::make_unique<ninx::parser::element::TextElement,std::__cxx11::string_const&>(&name);
      local_50 = (undefined1  [8])name._M_dataplus;
      break;
    case 1:
      this_02 = (Limiter *)
                __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                               &lexer::token::Limiter::typeinfo,0);
      cVar1 = lexer::token::Limiter::get_limiter(this_02);
      _limiter = CONCAT31(uStack_47,cVar1);
      iVar4 = std::
              _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(in_RSI + 0x30),&limiter);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        name._M_dataplus._M_p = (pointer)&name.field_2;
        std::__cxx11::string::_M_construct((ulong)&name,'\x01');
        std::make_unique<ninx::parser::element::TextElement,std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
        std::__cxx11::string::~string((string *)&name);
      }
      else {
        TokenReader::seek_previous(this_00);
        parse_operator_call((Parser *)&name,(char)in_RSI);
        local_50 = (undefined1  [8])name._M_dataplus;
      }
      break;
    default:
      goto switchD_0011f397_caseD_2;
    case 3:
      this_03 = (Variable *)
                __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                               &lexer::token::Variable::typeinfo,0);
      psVar5 = lexer::token::Variable::get_name_abi_cxx11_(this_03);
      std::__cxx11::string::string((string *)&name,(string *)psVar5);
      iVar2 = TokenReader::check_limiter(this_00,'=');
      if (iVar2 == 1) {
        TokenReader::get_token(this_00);
        parse_level_3_expression((Parser *)local_50);
        std::
        make_unique<ninx::parser::element::Assignment,std::__cxx11::string&,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&limiter,
                   (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                    *)&name);
        (this->origin)._M_dataplus._M_p = (pointer)CONCAT44(uStack_44,_limiter);
        if (local_50 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_50 + 8))();
        }
      }
      else {
        _limiter = lexer::token::Variable::get_trailing_spaces(this_03);
        std::make_unique<ninx::parser::element::VariableRead,std::__cxx11::string&,int>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   (int *)&name);
        (this->origin)._M_dataplus._M_p = (pointer)local_50;
      }
      std::__cxx11::string::~string((string *)&name);
      return (__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
              )(__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
                )this;
    case 4:
      TokenReader::seek_previous(this_00);
      parse_function_call((Parser *)&name);
      local_50 = (undefined1  [8])name._M_dataplus;
      break;
    case 5:
      parse_function_definition((Parser *)&name);
      local_50 = (undefined1  [8])name._M_dataplus;
      break;
    case 6:
      parse_operator_definition((Parser *)&name);
      local_50 = (undefined1  [8])name._M_dataplus;
      break;
    case 7:
      TokenReader::seek_previous(this_00);
      parse_if_statement((Parser *)&name);
      local_50 = (undefined1  [8])name._M_dataplus;
      break;
    case 10:
      TokenReader::seek_previous(this_00);
      parse_for_statement((Parser *)&name);
      local_50 = (undefined1  [8])name._M_dataplus;
    }
    (this->origin)._M_dataplus._M_p = (pointer)local_50;
  }
  return (__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Statement> ninx::parser::Parser::parse_statement() {
    Token *token{reader.get_token()};

    if (token) {
        switch (token->get_type()) {
            case Type::FUNCDEF: {
                return parse_function_definition();
            }
            case Type::OPDEF: {
                return parse_operator_definition();
            }
            case Type::VARIABLE: {
                auto variable_token {dynamic_cast<ninx::lexer::token::Variable *>(token)};
                // Get the variable name
                auto name{variable_token->get_name()};

                // Determine if the variable is used in an assignment by peeking the next
                // token and checking if it is a limiter equal to =
                if (reader.check_limiter('=') == 1) {  // Assignment
                    // Skip the = limiter
                    reader.get_token();

                    auto value = parse_expression();

                    auto element = std::make_unique<ninx::parser::element::Assignment>(name, std::move(value));
                    return element;
                } else {  // Variable used as value
                    auto element = std::make_unique<ninx::parser::element::VariableRead>(name, variable_token->get_trailing_spaces());
                    return element;
                }
            }
            case Type::LIMITER: {
                auto limiter_token { dynamic_cast<ninx::lexer::token::Limiter *>(token) };
                char limiter {limiter_token->get_limiter()};

                if (operators.find(limiter) != operators.end()) {  // Operator found, parse it
                    reader.seek_previous();
                    return parse_operator_call(limiter);
                }else{  // Limiter not registered, default to a text element
                    auto element = std::make_unique<TextElement>(std::string(1, limiter));
                    return element;
                }
            }
            case Type::FUNCNAME: {
                reader.seek_previous();  // Seek to the previous token to make the function able to read it again
                return parse_function_call();
            }
            case Type::IF: {
                reader.seek_previous();  // Rewind the if block
                return parse_if_statement();
            }
            case Type::FOR: {
                reader.seek_previous();  // Rewind the for block
                return parse_for_statement();
            }
            case Type::TEXT: {
                auto element = std::make_unique<TextElement>(
                        dynamic_cast<ninx::lexer::token::Text *>(token)->get_text());
                return element;
            }
        }

        // TODO: throw parse exception for unexpected token
    }

    // End of the document
    return nullptr;
}